

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm1d.c
# Opt level: O2

void av1_iadst4(int32_t *input,int32_t *output,int8_t cos_bit,int8_t *stage_range)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int32_t iVar6;
  int32_t iVar7;
  int32_t iVar8;
  int iVar9;
  int iVar10;
  int32_t iVar11;
  long lVar12;
  
  iVar2 = *input;
  iVar3 = input[2];
  iVar4 = input[3];
  if (((input[1] == 0 && iVar2 == 0) && iVar3 == 0) && iVar4 == 0) {
    iVar6 = 0;
    iVar8 = 0;
    iVar11 = 0;
    iVar7 = 0;
  }
  else {
    iVar1 = cos_bit + -10;
    iVar9 = input[1] * av1_sinpi_arr_data[iVar1][3];
    iVar5 = av1_sinpi_arr_data[iVar1][2] * iVar4 + av1_sinpi_arr_data[iVar1][1] * iVar2 +
            av1_sinpi_arr_data[iVar1][4] * iVar3;
    lVar12 = 1L << (cos_bit - 1U & 0x3f);
    iVar7 = (int32_t)((iVar5 + iVar9) + lVar12 >> (cos_bit & 0x3fU));
    iVar10 = av1_sinpi_arr_data[iVar1][2] * iVar2 -
             (av1_sinpi_arr_data[iVar1][4] * iVar4 + av1_sinpi_arr_data[iVar1][1] * iVar3);
    iVar11 = (int32_t)((iVar10 + iVar9) + lVar12 >> (cos_bit & 0x3fU));
    iVar8 = (int32_t)(((iVar2 - iVar3) + iVar4) * av1_sinpi_arr_data[iVar1][3] + lVar12 >>
                     (cos_bit & 0x3fU));
    iVar6 = (int32_t)(((iVar10 - iVar9) + iVar5) + lVar12 >> (cos_bit & 0x3fU));
  }
  output[3] = iVar6;
  output[2] = iVar8;
  output[1] = iVar11;
  *output = iVar7;
  return;
}

Assistant:

void av1_iadst4(const int32_t *input, int32_t *output, int8_t cos_bit,
                const int8_t *stage_range) {
  int bit = cos_bit;
  const int32_t *sinpi = sinpi_arr(bit);
  int32_t s0, s1, s2, s3, s4, s5, s6, s7;

  int32_t x0 = input[0];
  int32_t x1 = input[1];
  int32_t x2 = input[2];
  int32_t x3 = input[3];

  if (!(x0 | x1 | x2 | x3)) {
    output[0] = output[1] = output[2] = output[3] = 0;
    return;
  }

  assert(sinpi[1] + sinpi[2] == sinpi[4]);

  // stage 1
  s0 = range_check_value(sinpi[1] * x0, stage_range[1] + bit);
  s1 = range_check_value(sinpi[2] * x0, stage_range[1] + bit);
  s2 = range_check_value(sinpi[3] * x1, stage_range[1] + bit);
  s3 = range_check_value(sinpi[4] * x2, stage_range[1] + bit);
  s4 = range_check_value(sinpi[1] * x2, stage_range[1] + bit);
  s5 = range_check_value(sinpi[2] * x3, stage_range[1] + bit);
  s6 = range_check_value(sinpi[4] * x3, stage_range[1] + bit);

  // stage 2
  // NOTICE: (x0 - x2) here may use one extra bit compared to the
  // opt_range_row/col specified in av1_gen_inv_stage_range()
  s7 = range_check_value((x0 - x2) + x3, stage_range[2]);

  // stage 3
  s0 = range_check_value(s0 + s3, stage_range[3] + bit);
  s1 = range_check_value(s1 - s4, stage_range[3] + bit);
  s3 = range_check_value(s2, stage_range[3] + bit);
  s2 = range_check_value(sinpi[3] * s7, stage_range[3] + bit);

  // stage 4
  s0 = range_check_value(s0 + s5, stage_range[4] + bit);
  s1 = range_check_value(s1 - s6, stage_range[4] + bit);

  // stage 5
  x0 = range_check_value(s0 + s3, stage_range[5] + bit);
  x1 = range_check_value(s1 + s3, stage_range[5] + bit);
  x2 = range_check_value(s2, stage_range[5] + bit);
  x3 = range_check_value(s0 + s1, stage_range[5] + bit);

  // stage 6
  x3 = range_check_value(x3 - s3, stage_range[6] + bit);

  output[0] = round_shift(x0, bit);
  output[1] = round_shift(x1, bit);
  output[2] = round_shift(x2, bit);
  output[3] = round_shift(x3, bit);
}